

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsnode_bmod.c
# Opt level: O2

int zsnode_bmod(int jcol,int jsupno,int fsupc,doublecomplex *dense,doublecomplex *tempv,
               GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  double *pdVar1;
  double *pdVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  flops_t *pfVar6;
  int_t *piVar7;
  int_t *piVar8;
  void *pvVar9;
  int_t *piVar10;
  double dVar11;
  double dVar12;
  ulong uVar13;
  int ldm;
  ulong uVar14;
  int iVar15;
  doublecomplex *rhs;
  uint nrow;
  long lVar16;
  double *pdVar17;
  
  pfVar6 = stat->ops;
  piVar7 = Glu->lsub;
  piVar8 = Glu->xlsub;
  pvVar9 = Glu->lusup;
  piVar10 = Glu->xlusup;
  uVar14 = (ulong)piVar10[jcol];
  pdVar17 = (double *)(uVar14 * 0x10 + (long)pvVar9);
  for (lVar16 = (long)piVar8[fsupc]; lVar16 < piVar8[(long)fsupc + 1]; lVar16 = lVar16 + 1) {
    iVar15 = piVar7[lVar16];
    dVar11 = dense[iVar15].i;
    *pdVar17 = dense[iVar15].r;
    pdVar17[1] = dVar11;
    dense[iVar15].r = 0.0;
    dense[iVar15].i = 0.0;
    uVar14 = (ulong)((int)uVar14 + 1);
    pdVar17 = pdVar17 + 2;
  }
  piVar10[(long)jcol + 1] = (int)uVar14;
  iVar15 = jcol - fsupc;
  if (iVar15 != 0 && fsupc <= jcol) {
    iVar4 = piVar10[fsupc];
    ldm = piVar8[(long)fsupc + 1] - piVar8[fsupc];
    nrow = ldm - iVar15;
    iVar5 = piVar10[jcol];
    pfVar6[0x13] = (float)((iVar15 + -1) * iVar15 * 4) + pfVar6[0x13];
    pfVar6[0x14] = (float)(int)(iVar15 * nrow * 8) + pfVar6[0x14];
    rhs = (doublecomplex *)((long)iVar5 * 0x10 + (long)pvVar9);
    zlsolve(ldm,iVar15,(doublecomplex *)((long)iVar4 * 0x10 + (long)pvVar9),rhs);
    zmatvec(ldm,nrow,iVar15,(doublecomplex *)(((long)iVar4 + (long)iVar15) * 0x10 + (long)pvVar9),
            rhs,tempv);
    iVar15 = iVar15 + iVar5;
    uVar13 = 0;
    uVar14 = (ulong)nrow;
    if ((int)nrow < 1) {
      uVar14 = uVar13;
    }
    for (; uVar14 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
      pdVar17 = (double *)((long)pvVar9 + uVar13 + (long)iVar15 * 0x10);
      dVar11 = pdVar17[1];
      pdVar1 = (double *)((long)&tempv->r + uVar13);
      dVar12 = pdVar1[1];
      pdVar2 = (double *)((long)pvVar9 + uVar13 + (long)iVar15 * 0x10);
      *pdVar2 = *pdVar17 - *pdVar1;
      pdVar2[1] = dVar11 - dVar12;
      puVar3 = (undefined8 *)((long)&tempv->r + uVar13);
      *puVar3 = 0;
      puVar3[1] = 0;
    }
  }
  return 0;
}

Assistant:

int
zsnode_bmod (
	    const int  jcol,	  /* in */
	    const int  jsupno,    /* in */
	    const int  fsupc,     /* in */
	    doublecomplex     *dense,    /* in */
	    doublecomplex     *tempv,    /* working array */
	    GlobalLU_t *Glu,      /* modified */
	    SuperLUStat_t *stat   /* output */
	    )
{
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int            incx = 1, incy = 1;
    doublecomplex         alpha = {-1.0, 0.0},  beta = {1.0, 0.0};
#endif

    doublecomplex   comp_zero = {0.0, 0.0};
    int     nsupc, nsupr, nrow;
    int_t   isub, irow;
    int_t   ufirst, nextlu;
    int_t   *lsub, *xlsub;
    doublecomplex *lusup;
    int_t   *xlusup, luptr;
    flops_t *ops = stat->ops;

    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;

    nextlu = xlusup[jcol];
    
    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = comp_zero;
	++nextlu;
    }

    xlusup[jcol + 1] = nextlu;	/* Initialize xlusup for next column */
    
    if ( fsupc < jcol ) {

	luptr = xlusup[fsupc];
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nsupc = jcol - fsupc;	/* Excluding jcol */
	ufirst = xlusup[jcol];	/* Points to the beginning of column
				   jcol in supernode L\U(jsupno). */
	nrow = nsupr - nsupc;

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	ztrsv_( "L", "N", "U", &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	zgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	zlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );
	zmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc], 
			&lusup[ufirst], &tempv[0] );

	int_t i, iptr; 
        /* Scatter tempv[*] into lusup[*] */
	iptr = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    z_sub(&lusup[iptr], &lusup[iptr], &tempv[i]);
            ++iptr;
	    tempv[i] = comp_zero;
	}
#endif

    }

    return 0;
}